

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerpTangentPoints.cpp
# Opt level: O0

void GeoCalcs::PerpTangentPoints
               (LLPoint *lineStart,double crs,LLPoint *center,double radius,LLPoint *linePts,
               LLPoint *tanPts,double dTol)

{
  double dVar1;
  LLPoint LVar2;
  bool local_10c;
  bool local_10a;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  int local_c4;
  double dStack_c0;
  int k;
  double dErr;
  double dStack_b0;
  int maxCount;
  double delta;
  double crs21;
  LLPoint perpPt;
  double dDistFromPt;
  double dCrsFromPt;
  double local_78;
  LLPoint local_70;
  double local_60;
  double signAngle1;
  InverseResult result;
  double dTol_local;
  LLPoint *tanPts_local;
  LLPoint *linePts_local;
  double radius_local;
  LLPoint *center_local;
  double crs_local;
  LLPoint *lineStart_local;
  
  result.distance = dTol;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&signAngle1);
  DistVincenty(lineStart,center,(InverseResult *)&signAngle1);
  dVar1 = SignAzimuthDifference(crs,signAngle1);
  local_60 = (double)(~-(ulong)(0.0 <= dVar1) & 0xbff0000000000000 |
                     -(ulong)(0.0 <= dVar1) & 0x3ff0000000000000);
  if (result.distance <= ABS(result.reverseAzimuth * (signAngle1 - crs))) {
    _crs21 = PerpIntercept(lineStart,crs,center,&dDistFromPt,&perpPt.longitude,result.distance);
    DistVincenty((LLPoint *)&crs21,lineStart,(InverseResult *)&signAngle1);
    dVar1 = signAngle1;
    dStack_c0 = 0.0;
    local_c4 = 0;
    dStack_b0 = radius;
    while( true ) {
      local_10a = true;
      if (local_c4 != 0) {
        local_10a = result.distance < ABS(dStack_c0) && local_c4 < 0xf;
      }
      if (!local_10a) break;
      LVar2 = DestVincenty((LLPoint *)&crs21,dVar1 + 3.141592653589793,dStack_b0);
      local_d8 = LVar2.latitude;
      linePts->latitude = local_d8;
      local_d0 = LVar2.longitude;
      linePts->longitude = local_d0;
      DistVincenty(linePts,(LLPoint *)&crs21,(InverseResult *)&signAngle1);
      LVar2 = PerpIntercept(linePts,-local_60 * 1.5707963267948966 + signAngle1,center,&dDistFromPt,
                            &perpPt.longitude,result.distance);
      local_e8 = LVar2.latitude;
      tanPts->latitude = local_e8;
      local_e0 = LVar2.longitude;
      tanPts->longitude = local_e0;
      dStack_c0 = perpPt.longitude - radius;
      dStack_b0 = dStack_b0 - dStack_c0;
      local_c4 = local_c4 + 1;
    }
    dStack_c0 = 0.0;
    local_c4 = 0;
    while( true ) {
      local_10c = true;
      if (local_c4 != 0) {
        local_10c = result.distance < ABS(dStack_c0) && local_c4 < 0xf;
      }
      if (!local_10c) break;
      LVar2 = DestVincenty((LLPoint *)&crs21,dVar1,dStack_b0);
      local_f8 = LVar2.latitude;
      linePts[1].latitude = local_f8;
      local_f0 = LVar2.longitude;
      linePts[1].longitude = local_f0;
      DistVincenty(linePts + 1,(LLPoint *)&crs21,(InverseResult *)&signAngle1);
      LVar2 = PerpIntercept(linePts + 1,-local_60 * 1.5707963267948966 + signAngle1,center,
                            &dDistFromPt,&perpPt.longitude,result.distance);
      local_108 = LVar2.latitude;
      tanPts[1].latitude = local_108;
      local_100 = LVar2.longitude;
      tanPts[1].longitude = local_100;
      dStack_c0 = perpPt.longitude - radius;
      dStack_b0 = dStack_b0 - dStack_c0;
      local_c4 = local_c4 + 1;
    }
  }
  else {
    local_70 = DestVincenty(lineStart,crs,result.reverseAzimuth - radius);
    tanPts->latitude = local_70.latitude;
    tanPts->longitude = local_70.longitude;
    LVar2 = DestVincenty(lineStart,crs,result.reverseAzimuth + radius);
    dCrsFromPt = LVar2.latitude;
    tanPts[1].latitude = dCrsFromPt;
    local_78 = LVar2.longitude;
    tanPts[1].longitude = local_78;
    linePts->latitude = tanPts->latitude;
    linePts->longitude = tanPts->longitude;
    linePts[1].latitude = tanPts[1].latitude;
    linePts[1].longitude = tanPts[1].longitude;
  }
  return;
}

Assistant:

void PerpTangentPoints(const LLPoint &lineStart, double crs,
                           const LLPoint &center, double radius,
                           LLPoint *linePts, LLPoint *tanPts, double dTol)
    {
        InverseResult result;
        DistVincenty(lineStart, center, result);
        const double signAngle1 = SignAzimuthDifference(crs, result.azimuth) >= 0.0 ? 1.0 : -1.0;

        if (fabs(result.distance * (result.azimuth - crs)) < dTol)
        {
            tanPts[0] = DestVincenty(lineStart, crs, result.distance - radius);
            tanPts[1] = DestVincenty(lineStart, crs, result.distance + radius);
            linePts[0] = tanPts[0];
            linePts[1] = tanPts[1];
            return;
        }

        double dCrsFromPt, dDistFromPt;
        LLPoint perpPt = PerpIntercept(lineStart, crs, center, dCrsFromPt, dDistFromPt, dTol);

        DistVincenty(perpPt, lineStart, result);
        const double crs21 = result.azimuth;

        double delta = radius;
        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            linePts[0] = DestVincenty(perpPt, crs21 + M_PI, delta);
            DistVincenty(linePts[0], perpPt, result);

            tanPts[0] = PerpIntercept(linePts[0], result.azimuth - signAngle1 * M_PI_2,
                                      center, dCrsFromPt, dDistFromPt, dTol);
            dErr = dDistFromPt - radius;
            delta = delta - dErr;
            k++;
        }

        dErr = 0.0;
        k = 0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            linePts[1] = DestVincenty(perpPt, crs21, delta);
            DistVincenty(linePts[1], perpPt, result);

            tanPts[1] = PerpIntercept(linePts[1], result.azimuth - signAngle1 * M_PI_2,
                                      center, dCrsFromPt, dDistFromPt, dTol);
            dErr = dDistFromPt - radius;
            delta = delta - dErr;
            k++;
        }

        return;
    }